

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
          (DrawIndirectBase *this,GLboolean mapped,GLbitfield access,GLbitfield accessFlag,
          GLintptr offset,GLsizeiptr length)

{
  GLboolean value;
  GLboolean value_00;
  GLbitfield access_00;
  GLbitfield access_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char (*pacVar2) [13];
  CallLogWrapper *this_00;
  int v;
  DIResult result;
  uint local_390;
  GLbitfield local_38c;
  string local_388;
  string local_368;
  GLsizeiptr local_348;
  GLintptr local_340;
  DILogger local_338;
  DIResult local_1b8;
  
  local_38c = accessFlag;
  local_348 = length;
  local_340 = offset;
  DIResult::DIResult(&local_1b8);
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bb,(GLint *)&local_390);
  if (local_390 != access) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_368,(DrawIndirectBase *)(ulong)local_390,access_00);
    pbVar1 = &local_368;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pbVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(char (*) [13])pbVar1)
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
              (&local_388,(DrawIndirectBase *)(ulong)access,access_01);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x911f,(GLint *)&local_390);
  if (local_390 != accessFlag) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [74])
               "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: ");
    pacVar2 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_38c);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x88bc,(GLint *)&local_390);
  if (local_390 != mapped) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [68])"glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: ")
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_368,(DrawIndirectBase *)(ulong)(byte)local_390,value);
    pbVar1 = &local_368;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pbVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(char (*) [13])pbVar1)
    ;
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_388,(DrawIndirectBase *)(ulong)(access & 0xff),value_00);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9121,(GLint *)&local_390);
  if ((int)local_390 != offset) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: ");
    pacVar2 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_340);
    DILogger::~DILogger(&local_338);
  }
  glu::CallLogWrapper::glGetBufferParameteriv(this_00,0x8f3f,0x9120,(GLint *)&local_390);
  if ((int)local_390 != length) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,
               (char (*) [73])
               "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: ");
    pacVar2 = (char (*) [13])&local_390;
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(int *)pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,pacVar2);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_348);
    DILogger::~DILogger(&local_338);
  }
  DILogger::~DILogger(&local_1b8.logger_);
  return local_1b8.status_;
}

Assistant:

long StateValidate(GLboolean mapped, GLbitfield access, GLbitfield accessFlag, GLintptr offset, GLsizeiptr length)
	{
		DIResult result;

		if (!api::isES())
		{
			int v;
			glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS, &v);
			if (v != static_cast<int>(access))
			{
				result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS) returned incorrect state: "
							   << AccessToString(v) << ", expected: " << AccessToString(access);
			}
		}

		int v;
		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_ACCESS_FLAGS, &v);
		if (v != static_cast<int>(accessFlag))
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_ACCESS_FLAGS) returned incorrect state: " << v
						   << ", expected: " << accessFlag;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAPPED, &v);
		if (v != mapped)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAPPED) returned incorrect state: "
						   << BoolToString((GLboolean)v) << ", expected: " << BoolToString((GLboolean)access);
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_OFFSET, &v);
		if (v != offset)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_OFFSET) returned incorrect offset: " << v
						   << ", expected: " << offset;
		}

		glGetBufferParameteriv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_LENGTH, &v);
		if (v != length)
		{
			result.error() << "glGetBufferParameteriv(GL_BUFFER_MAP_LENGTH) returned incorrect length: " << v
						   << ", expected: " << length;
		}

		return result.code();
	}